

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterAdvanced(Fts5Index *p,Fts5Iter *pIter,int iChanged,int iMinset)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Fts5Iter *in_RDI;
  bool bVar3;
  Fts5SegIter *pSeg;
  int iEq;
  int i;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x48) + in_EDX;
  while( true ) {
    local_1c = local_1c / 2;
    bVar3 = false;
    if (in_ECX <= local_1c) {
      bVar3 = *(int *)((long)&in_RDI->pColset + 4) == 0;
    }
    if (!bVar3) break;
    iVar1 = fts5MultiIterDoCompare(in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (iVar1 != 0) {
      lVar2 = in_RSI + 0x68 + (long)iVar1 * 0x80;
      (**(code **)(lVar2 + 0x30))(in_RDI,lVar2,0);
      local_1c = *(int *)(in_RSI + 0x48) + iVar1;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterAdvanced(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  int iMinset                     /* Minimum entry in aFirst[] to set */
){
  int i;
  for(i=(pIter->nSeg+iChanged)/2; i>=iMinset && p->rc==SQLITE_OK; i=i/2){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, i)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      assert( p->rc==SQLITE_OK );
      pSeg->xNext(p, pSeg, 0);
      i = pIter->nSeg + iEq;
    }
  }
}